

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

size_t InsertInt(FILE *f,uint data)

{
  size_t sVar1;
  undefined1 local_18;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  uint local_14;
  uchar buf [4];
  uint data_local;
  FILE *f_local;
  
  local_15 = (undefined1)data;
  local_16 = (undefined1)(data >> 8);
  local_17 = (undefined1)(data >> 0x10);
  local_18 = (undefined1)(data >> 0x18);
  local_14 = data;
  _buf = f;
  sVar1 = fwrite(&local_18,1,2,(FILE *)f);
  return sVar1;
}

Assistant:

size_t InsertInt(FILE* f, unsigned int data)
{
   unsigned char buf[4];
   buf[3] = (data & 0xFF);
   buf[2] = ((data >> 8) & 0xFF);
   buf[1] = ((data >> 16) & 0xFF);
   buf[0] = ((data >> 24) & 0xFF);
   return fwrite(buf, 1, 2, f);
}